

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FundamentalParameterData.cpp
# Opt level: O2

void __thiscall
KDIS::DATA_TYPE::FundamentalParameterData::FundamentalParameterData(FundamentalParameterData *this)

{
  DataTypeBase::DataTypeBase(&this->super_DataTypeBase);
  (this->super_DataTypeBase)._vptr_DataTypeBase = (_func_int **)&PTR__DataTypeBase_00217dc0;
  this->m_f32Freq = 0.0;
  this->m_f32FreqRange = 0.0;
  this->m_f32EffectiveRadiatedPower = 0.0;
  this->m_f32PulseRepetitionFreq = 0.0;
  this->m_f32PulseWidth = 0.0;
  this->m_f32BeamAzimuthCenter = 0.0;
  this->m_f32BeamAzimuthSweep = 0.0;
  this->m_f32BeamElevationCenter = 0.0;
  this->m_f32BeamElevationSweep = 0.0;
  this->m_f32BeamSweepSync = 0.0;
  return;
}

Assistant:

FundamentalParameterData::FundamentalParameterData() :
    m_f32Freq( 0 ),
    m_f32FreqRange( 0 ),
    m_f32EffectiveRadiatedPower( 0 ),
    m_f32PulseRepetitionFreq( 0 ),
    m_f32PulseWidth( 0 ),
    m_f32BeamAzimuthCenter( 0 ),
    m_f32BeamAzimuthSweep( 0 ),
    m_f32BeamElevationCenter( 0 ),
    m_f32BeamElevationSweep( 0 ),
    m_f32BeamSweepSync( 0 )
{
}